

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Valuator.cxx
# Opt level: O3

void __thiscall Fl_Valuator::step(Fl_Valuator *this,double s)

{
  double __x;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  double dVar4;
  
  __x = -s;
  if (-s <= s) {
    __x = s;
  }
  dVar4 = rint(__x);
  this->A = dVar4;
  this->B = 1;
  if (4.66e-10 < ABS(__x - dVar4)) {
    uVar2 = 1;
    do {
      uVar1 = uVar2 * 10;
      dVar4 = rint(__x * (double)(int)uVar1);
      if (ABS(__x - dVar4 / (double)(int)uVar1) <= 4.66e-10) break;
      bVar3 = uVar2 < 0x147ae15;
      uVar2 = uVar1;
    } while (bVar3);
    this->B = uVar1;
    this->A = dVar4;
  }
  return;
}

Assistant:

void Fl_Valuator::step(double s) {
  if (s < 0) s = -s;
  A = rint(s);
  B = 1;
  while (fabs(s-A/B) > epsilon && B<=(0x7fffffff/10)) {B *= 10; A = rint(s*B);}
}